

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionEval.cpp
# Opt level: O1

ExprBase * EvaluateFor(ExpressionEvalContext *ctx,ExprFor *expression)

{
  StackFrame *pSVar1;
  Allocator *pAVar2;
  SynBase *pSVar3;
  TypeBase *pTVar4;
  bool bVar5;
  char cVar6;
  uint uVar7;
  int iVar8;
  long in_RAX;
  ExprBase *pEVar9;
  undefined4 extraout_var;
  longlong result;
  long local_38;
  
  if (ctx->instruction < ctx->instructionsLimit) {
    ctx->instruction = ctx->instruction + 1;
    uVar7 = (ctx->stackFrames).count;
    if (uVar7 == 0) {
      __assert_fail("count > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                    ,0x172,
                    "T &SmallArray<ExpressionEvalContext::StackFrame *, 32>::back() [T = ExpressionEvalContext::StackFrame *, N = 32]"
                   );
    }
    pSVar1 = (ctx->stackFrames).data[uVar7 - 1];
    local_38 = in_RAX;
    if (pSVar1->targetYield != 0) goto LAB_0013ed2d;
    pEVar9 = Evaluate(ctx,expression->initializer);
    while (pEVar9 != (ExprBase *)0x0) {
LAB_0013ed2d:
      do {
        if (ctx->instructionsLimit <= ctx->instruction) {
          Report(ctx,"ERROR: instruction limit reached");
          return (ExprBase *)0x0;
        }
        ctx->instruction = ctx->instruction + 1;
        if (pSVar1->targetYield == 0) {
          if (expression->condition == (ExprBase *)0x0) {
            return (ExprBase *)0x0;
          }
          pEVar9 = Evaluate(ctx,expression->condition);
          if (pEVar9 == (ExprBase *)0x0) {
LAB_0013edb5:
            cVar6 = '\x01';
          }
          else {
            bVar5 = TryTakeLong(pEVar9,&local_38);
            if (!bVar5) {
              Report(ctx,"ERROR: failed to evaluate \'for\' condition");
              goto LAB_0013edb5;
            }
            cVar6 = (local_38 == 0) * '\x02';
          }
          if (cVar6 != '\0') {
            if (cVar6 != '\x02') {
              return (ExprBase *)0x0;
            }
            goto LAB_0013ee2e;
          }
        }
        pEVar9 = Evaluate(ctx,expression->body);
        if (pEVar9 == (ExprBase *)0x0) {
          return (ExprBase *)0x0;
        }
        if (pSVar1->breakDepth != 0) {
          pSVar1->breakDepth = pSVar1->breakDepth - 1;
LAB_0013ee2e:
          pAVar2 = ctx->ctx->allocator;
          iVar8 = (*pAVar2->_vptr_Allocator[2])(pAVar2,0x30);
          pEVar9 = (ExprBase *)CONCAT44(extraout_var,iVar8);
          pSVar3 = (expression->super_ExprBase).source;
          pTVar4 = ctx->ctx->typeVoid;
          pEVar9->typeID = 2;
          pEVar9->source = pSVar3;
          pEVar9->type = pTVar4;
          pEVar9->next = (ExprBase *)0x0;
          pEVar9->listed = false;
          pEVar9->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00229698;
          pEVar9 = CheckType(&expression->super_ExprBase,pEVar9);
          return pEVar9;
        }
        if (((pSVar1->continueDepth != 0) &&
            (uVar7 = pSVar1->continueDepth - 1, pSVar1->continueDepth = uVar7, uVar7 != 0)) ||
           (pSVar1->returnValue != (ExprBase *)0x0)) goto LAB_0013ee2e;
      } while (pSVar1->targetYield != 0);
      pEVar9 = Evaluate(ctx,expression->increment);
    }
  }
  else {
    Report(ctx,"ERROR: instruction limit reached");
  }
  return (ExprBase *)0x0;
}

Assistant:

ExprBase* EvaluateFor(ExpressionEvalContext &ctx, ExprFor *expression)
{
	if(!AddInstruction(ctx))
		return NULL;

	ExpressionEvalContext::StackFrame *frame = ctx.stackFrames.back();

	if(!frame->targetYield)
	{
		if(!Evaluate(ctx, expression->initializer))
			return NULL;
	}

	for(;;)
	{
		if(!AddInstruction(ctx))
			return NULL;

		if(!frame->targetYield)
		{
			if(!expression->condition)
				return NULL;

			ExprBase *condition = Evaluate(ctx, expression->condition);

			if(!condition)
				return NULL;

			long long result;
			if(!TryTakeLong(condition, result))
				return Report(ctx, "ERROR: failed to evaluate 'for' condition");

			if(!result)
				break;
		}

		if(!Evaluate(ctx, expression->body))
			return NULL;

		// On break, decrease depth and exit
		if(frame->breakDepth)
		{
			frame->breakDepth--;
			break;
		}

		// On continue, decrease depth and proceed to next iteration, unless it's a multi-level continue
		if(frame->continueDepth)
		{
			frame->continueDepth--;

			if(frame->continueDepth)
				break;
		}

		if(frame->returnValue)
			break;

		if(!frame->targetYield)
		{
			if(!Evaluate(ctx, expression->increment))
				return NULL;
		}
	}

	return CheckType(expression, new (ctx.ctx.get<ExprVoid>()) ExprVoid(expression->source, ctx.ctx.typeVoid));
}